

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

bool __thiscall trun::Process_Unix::IsFinished(Process_Unix *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __pid_t _Var2;
  ILogger *pIVar3;
  int status;
  byte local_34 [4];
  string local_30;
  
  _Var2 = waitpid(this->pid,(int *)local_34,3);
  if (_Var2 != 0) {
    paVar1 = &local_30.field_2;
    local_30._M_dataplus._M_p = (pointer)paVar1;
    if (_Var2 != -1) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Process_Unix","");
      pIVar3 = gnilk::Logger::GetLogger(&local_30);
      gnilk::Log::Debug<char_const*>(pIVar3,"Process exit");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != paVar1) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      if ((local_34[0] & 0x7f) == 0) {
        this->exitStatus = kNormal;
      }
      else {
        this->exitStatus = kAbnormal;
      }
      return true;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Process_Unix","");
    pIVar3 = gnilk::Logger::GetLogger(&local_30);
    gnilk::Log::Error<char_const*>(pIVar3,"Process error");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return false;
}

Assistant:

bool Process_Unix::IsFinished() {
	int status;
	pid_t result = waitpid(pid, &status, WNOHANG | WUNTRACED);
	if (result == 0) {
	  // Child still alive
	} else if (result == -1) {
	  // Error 
        gnilk::Logger::GetLogger("Process_Unix")->Error("Process error");
	} else {
	    // Child exited
        gnilk::Logger::GetLogger("Process_Unix")->Debug("Process exit");
        if (WIFEXITED(status)) {
            exitStatus = ProcessExitStatus::kNormal;
        } else {
            exitStatus = ProcessExitStatus::kAbnormal;
        }
        //int exitCode = WEXITSTATUS(status);
		return true;
	}		
	return false;
}